

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# didxset.cpp
# Opt level: O0

void __thiscall soplex::DIdxSet::DIdxSet(DIdxSet *this,int n)

{
  int in_ESI;
  IdxSet *in_RDI;
  int in_stack_0000000c;
  int **in_stack_00000010;
  int local_2c;
  
  IdxSet::IdxSet(in_RDI);
  in_RDI->_vptr_IdxSet = (_func_int **)&PTR__DIdxSet_004ea6f8;
  local_2c = in_ESI;
  if (in_ESI < 1) {
    local_2c = 1;
  }
  in_RDI->len = local_2c;
  spx_alloc<int*>(in_stack_00000010,in_stack_0000000c);
  return;
}

Assistant:

DIdxSet::DIdxSet(int n)
   : IdxSet()
{
   len = (n < 1) ? 1 : n;
   spx_alloc(idx, len);
}